

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O0

void __thiscall
tchecker::details::
statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>::visit
          (statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
           *this,typed_local_array_statement_t *stmt)

{
  typed_var_expression_t *ptVar1;
  value_type_conflict2 local_50 [4];
  value_type_conflict2 local_30;
  uint local_24;
  uint local_20;
  variable_size_t i;
  variable_size_t asize;
  variable_size_t id;
  typed_local_array_statement_t *stmt_local;
  statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  *this_local;
  
  _asize = stmt;
  stmt_local = (typed_local_array_statement_t *)this;
  ptVar1 = typed_local_array_statement_t::variable(stmt);
  i = typed_var_expression_t::id(ptVar1);
  ptVar1 = typed_local_array_statement_t::variable(_asize);
  local_20 = (**(code **)(*(long *)&(ptVar1->super_typed_lvalue_expression_t).
                                    super_typed_expression_t + 0x38))();
  for (local_24 = 0; local_24 < local_20; local_24 = local_24 + 1) {
    local_30 = 5;
    std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
              (&this->_bytecode_back_inserter,&local_30);
    local_50[3] = (value_type_conflict2)(i + local_24);
    std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
              (&this->_bytecode_back_inserter,local_50 + 3);
    local_50[2] = 5;
    std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
              (&this->_bytecode_back_inserter,local_50 + 2);
    local_50[1] = 0;
    std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
              (&this->_bytecode_back_inserter,local_50 + 1);
    local_50[0] = 0x1c;
    std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
              (&this->_bytecode_back_inserter,local_50);
  }
  return;
}

Assistant:

virtual void visit(tchecker::typed_local_array_statement_t const & stmt)
  {
    tchecker::variable_size_t id = stmt.variable().id();
    tchecker::variable_size_t asize = stmt.variable().size();

    for (tchecker::variable_size_t i = 0; i < asize; i++) {
      _bytecode_back_inserter = VM_PUSH;
      _bytecode_back_inserter = id + i;
      _bytecode_back_inserter = VM_PUSH;
      _bytecode_back_inserter = 0;
      _bytecode_back_inserter = VM_INIT_FRAME;
    }
  }